

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O2

BoxArray * __thiscall amrex::BoxArray::convert(BoxArray *this,_func_Box_Box_ptr *fp)

{
  element_type *peVar1;
  int i;
  int index;
  int iVar2;
  Box BStack_68;
  Box local_4c;
  
  peVar1 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar2 = (int)(((long)*(pointer *)
                        ((long)&(peVar1->m_abox).
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data + 8) -
                *(long *)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data) / 0x1c);
  if (0 < iVar2) {
    uniqify(this);
    for (index = 0; iVar2 != index; index = index + 1) {
      operator[](&BStack_68,this,index);
      (*fp)(&local_4c,&BStack_68);
      set(this,index,&local_4c);
    }
  }
  return this;
}

Assistant:

BoxArray&
BoxArray::convert (Box (*fp)(const Box&))
{
    BL_ASSERT(!(fp == 0));

    const int N = size();
    if (N > 0) {
        uniqify();

#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
        for (int i = 0; i < N; ++i) {
            set(i,fp((*this)[i]));
        }
    }
    return *this;
}